

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

uint __thiscall Assimp::FBX::FBXConverter::GetDefaultMaterial(FBXConverter *this)

{
  uint uVar1;
  aiMaterial *this_00;
  aiMaterial *out_mat;
  aiColor3D local_428;
  aiString s;
  
  uVar1 = this->defaultMaterialIndex;
  if (uVar1 == 0) {
    this_00 = (aiMaterial *)operator_new(0x10);
    aiMaterial::aiMaterial(this_00);
    out_mat = this_00;
    std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::push_back(&this->materials,&out_mat);
    local_428.r = 0.8;
    local_428.g = 0.8;
    local_428.b = 0.8;
    aiMaterial::AddProperty(out_mat,&local_428,1,"$clr.diffuse",0,0);
    s.length = 0;
    s.data[0] = '\0';
    memset(s.data + 1,0x1b,0x3ff);
    aiString::Set(&s,"DefaultMaterial");
    aiMaterial::AddProperty(out_mat,&s,"?mat.name",0,0);
    uVar1 = (uint)((ulong)((long)(this->materials).
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->materials).
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
    this->defaultMaterialIndex = uVar1;
  }
  return uVar1 - 1;
}

Assistant:

unsigned int FBXConverter::GetDefaultMaterial()
        {
            if (defaultMaterialIndex) {
                return defaultMaterialIndex - 1;
            }

            aiMaterial* out_mat = new aiMaterial();
            materials.push_back(out_mat);

            const aiColor3D diffuse = aiColor3D(0.8f, 0.8f, 0.8f);
            out_mat->AddProperty(&diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);

            aiString s;
            s.Set(AI_DEFAULT_MATERIAL_NAME);

            out_mat->AddProperty(&s, AI_MATKEY_NAME);

            defaultMaterialIndex = static_cast<unsigned int>(materials.size());
            return defaultMaterialIndex - 1;
        }